

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

server_extension * server_extension_detect(xcb_connection_t *connection)

{
  _Bool _Var1;
  server_extension *psVar2;
  xcb_query_extension_reply_t *pxVar3;
  server_extension_type sVar4;
  
  psVar2 = (server_extension *)malloc(0x10);
  if (psVar2 == (server_extension *)0x0) {
    return (server_extension *)0x0;
  }
  pxVar3 = (xcb_query_extension_reply_t *)xcb_get_extension_data(connection,&xcb_randr_id);
  if ((pxVar3 == (xcb_query_extension_reply_t *)0x0) || (sVar4 = RANDR, pxVar3->present == '\0')) {
    pxVar3 = (xcb_query_extension_reply_t *)xcb_get_extension_data(connection,&xcb_xinerama_id);
    if ((pxVar3 != (xcb_query_extension_reply_t *)0x0) && (pxVar3->present != '\0')) {
      _Var1 = xinerama_is_active(connection);
      sVar4 = XINERAMA;
      if (_Var1) goto LAB_00108319;
    }
    sVar4 = NO_EXTENSION;
    pxVar3 = (xcb_query_extension_reply_t *)0x0;
  }
LAB_00108319:
  psVar2->type = sVar4;
  psVar2->data_cache = pxVar3;
  return psVar2;
}

Assistant:

struct server_extension *server_extension_detect(xcb_connection_t *connection)
{
        struct server_extension *extension = malloc(sizeof(struct server_extension));

        if (extension == NULL) {
                return NULL;
        }

        const xcb_query_extension_reply_t *cache = XCB_NONE;

        cache = xcb_get_extension_data(connection, &xcb_randr_id);

        if (cache && cache->present) {
                extension->type = RANDR;
                extension->data_cache = cache;

                return extension;
        }

        cache = xcb_get_extension_data(connection, &xcb_xinerama_id);

        if ((cache && cache->present) && xinerama_is_active(connection)) {
                extension->type = XINERAMA;
                extension->data_cache = cache;

                return extension;
        }

        extension->type = NO_EXTENSION;
        extension->data_cache = NULL;

        return extension;
}